

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_local_time<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  uint16_t uVar1;
  bool bVar2;
  __tuple_element_t<0UL,_tuple<local_time,_local_time_format_info,_region>_> *p_Var3;
  __tuple_element_t<1UL,_tuple<local_time,_local_time_format_info,_region>_> *p_Var4;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  type reg;
  type fmt;
  type val;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  val_fmt_reg;
  location first;
  context<toml::type_config> *in_stack_00001910;
  location *in_stack_00001918;
  region *in_stack_fffffffffffffb58;
  success_type *s;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffffb60;
  success_type *this;
  location *in_stack_fffffffffffffb78;
  location *in_stack_fffffffffffffb80;
  undefined2 in_stack_fffffffffffffbb8;
  undefined6 in_stack_fffffffffffffbba;
  source_location in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc8 [16];
  unkbyte10 in_stack_fffffffffffffbe8;
  undefined8 in_stack_fffffffffffffc00;
  basic_value<toml::type_config> *v;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  local_f0;
  
  location::location(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  parse_local_time_only<toml::type_config>(in_stack_00001918,in_stack_00001910);
  bVar2 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
          ::is_err(&local_f0);
  if (bVar2) {
    result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
    ::unwrap_err((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                  *)CONCAT62(in_stack_fffffffffffffbba,in_stack_fffffffffffffbb8),
                 in_stack_fffffffffffffbc0);
    err<toml::error_info&>
              ((error_info *)CONCAT62(in_stack_fffffffffffffbba,in_stack_fffffffffffffbb8));
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffffb60,(failure_type *)in_stack_fffffffffffffb58);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x745956);
  }
  else {
    result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
    ::unwrap((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
              *)CONCAT62(in_stack_fffffffffffffbba,in_stack_fffffffffffffbb8),
             in_stack_fffffffffffffbc0);
    p_Var3 = std::get<0ul,toml::local_time,toml::local_time_format_info,toml::detail::region>
                       ((tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                         *)0x7459f3);
    uVar1 = p_Var3->nanosecond;
    result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
    ::unwrap((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
              *)CONCAT62(in_stack_fffffffffffffbba,in_stack_fffffffffffffbb8),
             in_stack_fffffffffffffbc0);
    p_Var4 = std::get<1ul,toml::local_time,toml::local_time_format_info,toml::detail::region>
                       ((tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                         *)0x745a3f);
    v = *(basic_value<toml::type_config> **)p_Var4;
    result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
    ::unwrap((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
              *)CONCAT62(in_stack_fffffffffffffbba,in_stack_fffffffffffffbb8),
             in_stack_fffffffffffffbc0);
    std::get<2ul,toml::local_time,toml::local_time_format_info,toml::detail::region>
              ((tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region> *)
               0x745a7f);
    region::region((region *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x745aed);
    s = (success_type *)&stack0xfffffffffffffbc0;
    region::region((region *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    this = s;
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)in_stack_fffffffffffffbc0._M_impl,
               (local_time_type)in_stack_fffffffffffffbe8,
               (local_time_format_info)in_stack_fffffffffffffbc8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT62(in_stack_fffffffffffffbba,uVar1),(region_type *)in_stack_fffffffffffffc00
              );
    ok<toml::basic_value<toml::type_config>>(v);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffffb60,s);
    success<toml::basic_value<toml::type_config>_>::~success
              ((success<toml::basic_value<toml::type_config>_> *)0x745b8b);
    basic_value<toml::type_config>::~basic_value
              ((basic_value<toml::type_config> *)in_stack_fffffffffffffb60);
    region::~region((region *)in_stack_fffffffffffffb60);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
    region::~region((region *)in_stack_fffffffffffffb60);
  }
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  ::~result((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
             *)0x745c59);
  location::~location((location *)in_stack_fffffffffffffb60);
  return in_RDI;
}

Assistant:

result<basic_value<TC>, error_info>
parse_local_time(location& loc, const context<TC>& ctx)
{
    const auto first = loc;

    auto val_fmt_reg = parse_local_time_only(loc, ctx);
    if(val_fmt_reg.is_err())
    {
        return err(val_fmt_reg.unwrap_err());
    }

    auto val = std::move(std::get<0>(val_fmt_reg.unwrap()));
    auto fmt = std::move(std::get<1>(val_fmt_reg.unwrap()));
    auto reg = std::move(std::get<2>(val_fmt_reg.unwrap()));

    return ok(basic_value<TC>(std::move(val), std::move(fmt), {}, std::move(reg)));
}